

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

Availability __thiscall
Satisfier<XOnlyPubKey>::SatRIPEMD160
          (Satisfier<XOnlyPubKey> *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *hash,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *preimage)

{
  Availability AVar1;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    AVar1 = MsLookupHelper<std::map<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      (&this->m_sig_data->ripemd160_preimages,hash,preimage);
    return AVar1;
  }
  __stack_chk_fail();
}

Assistant:

miniscript::Availability SatRIPEMD160(const std::vector<unsigned char>& hash, std::vector<unsigned char>& preimage) const {
        return MsLookupHelper(m_sig_data.ripemd160_preimages, hash, preimage);
    }